

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::ReadableDirectory,_std::nullptr_t> __thiscall
kj::newDiskReadableDirectory(kj *this,OwnFd *fd)

{
  ReadableDirectory *extraout_RDX;
  Own<kj::ReadableDirectory,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskReadableDirectory,_std::nullptr_t> local_28;
  
  heap<kj::(anonymous_namespace)::DiskReadableDirectory,kj::OwnFd>((kj *)&local_28,fd);
  *(Disposer **)this = local_28.disposer;
  *(DiskReadableDirectory **)(this + 8) = local_28.ptr;
  local_28.ptr = (DiskReadableDirectory *)0x0;
  Own<kj::(anonymous_namespace)::DiskReadableDirectory,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<ReadableDirectory> newDiskReadableDirectory(kj::OwnFd fd) {
  return heap<DiskReadableDirectory>(kj::mv(fd));
}